

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O2

void __thiscall
PolygonTriangulation::thread_endpoints
          (PolygonTriangulation *this,uint32_t segment_index,uint32_t max_y_index,
          uint32_t min_y_index)

{
  Trapezoid_t *trapezoid;
  Trapezoid_t *trapezoid_00;
  pointer pTVar1;
  uint key_index;
  uint32_t uVar2;
  pointer pTVar3;
  undefined8 uVar4;
  pointer pTVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  bool bVar10;
  uint32_t trapezoid_index;
  uint32_t *puVar11;
  QNode_t *right_fusion_node;
  ulong uVar12;
  ulong uVar13;
  vertex_t v;
  
  compute_offset_vertex(this,max_y_index,min_y_index,&v);
  trapezoid_index =
       search_trapezoid_index
                 (this,&v,(this->vertex_ynodes_).
                          super__Vector_base<PolygonTriangulation::QNode_t_*,_std::allocator<PolygonTriangulation::QNode_t_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[max_y_index]);
  key_index = this->used_trapezoid_count_;
  uVar13 = (ulong)key_index;
  this->used_trapezoid_count_ = key_index + 1;
  uVar12 = (ulong)trapezoid_index;
  pTVar3 = (this->trapezoids_).
           super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  trapezoid = pTVar3 + uVar12;
  trapezoid_00 = pTVar3 + uVar13;
  pTVar3[uVar13].sink = pTVar3[uVar12].sink;
  pTVar1 = pTVar3 + uVar12;
  uVar6 = pTVar1->max_y;
  uVar7 = pTVar1->min_y;
  uVar8 = pTVar1->left_segment;
  uVar9 = pTVar1->right_segment;
  pTVar1 = pTVar3 + uVar12;
  uVar2 = pTVar1->above2;
  uVar4 = *(undefined8 *)(&pTVar1->above1 + 2);
  pTVar5 = pTVar3 + uVar13;
  pTVar5->above1 = pTVar1->above1;
  pTVar5->above2 = uVar2;
  *(undefined8 *)(&pTVar5->above1 + 2) = uVar4;
  pTVar1 = pTVar3 + uVar13;
  pTVar1->max_y = uVar6;
  pTVar1->min_y = uVar7;
  pTVar1->left_segment = uVar8;
  pTVar1->right_segment = uVar9;
  if ((ulong)pTVar3[uVar12].above2 == 0xffffffff) {
    puVar11 = &(this->trapezoids_).
               super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ._M_impl.super__Vector_impl_data._M_start[trapezoid->above1].below2;
    uVar2 = *puVar11;
    if ((uVar2 == 0xffffffff) ||
       ((trapezoid_index == uVar2 && (trapezoid->left_segment != 0xffffffff)))) {
      *puVar11 = key_index;
    }
  }
  else {
    (this->trapezoids_).
    super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
    ._M_impl.super__Vector_impl_data._M_start[pTVar3[uVar12].above2].below1 = key_index;
    trapezoid_00->above1 = trapezoid->above2;
  }
  trapezoid->above2 = 0xffffffff;
  trapezoid_00->above2 = 0xffffffff;
  right_fusion_node = create_node(this,SINK,this->root_,key_index);
  split_merge_trapezoids
            (this,segment_index,min_y_index,trapezoid_index,(QNode_t *)0x0,right_fusion_node);
  bVar10 = is_top_triangle(this,trapezoid);
  if ((!bVar10) && (bVar10 = is_top_triangle(this,trapezoid_00), uVar12 = uVar13, !bVar10)) {
    return;
  }
  pTVar3[uVar12].above1 = 0xffffffff;
  return;
}

Assistant:

void PolygonTriangulation::thread_endpoints(
    const uint32_t segment_index,
    const uint32_t max_y_index,
    const uint32_t min_y_index
) {
  // Recursively split and merge trapezoids intersecting the segment.

  // To find the top trapezoid we need to offset the first vertex in the direction
  // of the segment, to distinct between left/right trapezoids neighbors.
  vertex_t v;
  compute_offset_vertex(max_y_index, min_y_index, v);

  /// @note could be constant instead, by storing two below sinks and a segment for each Y.
  /// furthermore this will prevent a bug when trapzeoid collapse (on same Ys).
  const auto top_trapezoid_index = search_trapezoid_index(v, vertex_ynodes_[max_y_index]); //
  const auto new_trapezoid_index = get_new_trapezoid_index();

  auto &top_trapezoid = trapezoids_[top_trapezoid_index];
  auto &new_trapezoid = trapezoids_[new_trapezoid_index];

  // Copy top trapezoid attributes to the new one.
  new_trapezoid = top_trapezoid;

  // Link first splitted trapezoid to the one above it.
  if (kInvalidIndex != top_trapezoid.above2) {
    trapezoids_[top_trapezoid.above2].below1 = new_trapezoid_index;
    new_trapezoid.above1 = top_trapezoid.above2;
  } else {
    auto &above_trapezoid = trapezoids_[top_trapezoid.above1];

    if (above_trapezoid.below2 == kInvalidIndex) {
      // case 1 : new empty trapezoid
      above_trapezoid.below2 = new_trapezoid_index;
    } else if (   (top_trapezoid_index == above_trapezoid.below2)
               && (kInvalidIndex != top_trapezoid.left_segment)) {
      // case 2 : old right trap will become a triangle
      above_trapezoid.below2 = new_trapezoid_index;
    }
  }
  top_trapezoid.above2 = kInvalidIndex;
  new_trapezoid.above2 = kInvalidIndex;

  // Every threading operation create one new sink, used as the right fusion sink
  // by default.
  auto *new_sink = create_node(SINK, root_, new_trapezoid_index);

#if DEBUG_INFO
  fprintf(stderr, "> split X : %d %d\n", max_y_index, min_y_index);
#endif
  split_merge_trapezoids(segment_index, min_y_index, top_trapezoid_index, nullptr, new_sink);

  // Close connections with above trapezoid when one of the start trapezoids
  // (left or right) is a triangle.
  if (is_top_triangle(top_trapezoid)) {
    top_trapezoid.above1 = kInvalidIndex;
  } else if (is_top_triangle(new_trapezoid)) {
    new_trapezoid.above1 = kInvalidIndex;
  }
}